

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O1

QString * uniqueItemName(QString *__return_storage_ptr__,QModelIndex *index)

{
  TreeModel *this;
  qsizetype qVar1;
  byte bVar2;
  UINT8 UVar3;
  UINT8 subtype;
  QByteArrayView QVar4;
  QString t_2;
  QString subtypeString;
  QString t_3;
  QString t;
  QString itemName;
  QString t_1;
  QString itemText;
  QString local_138;
  QArrayData *local_120;
  char16_t *local_118;
  qsizetype qStack_110;
  QArrayData *local_108;
  char16_t *local_100;
  QAbstractItemModel *pQStack_f8;
  QString local_f0;
  QString local_d8;
  QString local_c0;
  QString local_a8;
  QArrayData *local_90;
  char16_t *local_88;
  qsizetype qStack_80;
  QString local_78;
  QString local_60;
  QString local_48;
  
  if (((index->r < 0) || (index->c < 0)) || (index->m == (QAbstractItemModel *)0x0)) {
    QVar4.m_data = (storage_type *)0xc;
    QVar4.m_size = (qsizetype)&local_c0;
    QString::fromUtf8(QVar4);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = local_c0.d.d;
    (__return_storage_ptr__->d).ptr = local_c0.d.ptr;
    (__return_storage_ptr__->d).size = local_c0.d.size;
    return __return_storage_ptr__;
  }
  this = (TreeModel *)index->m;
  TreeModel::name(&local_c0,this,index);
  TreeModel::text(&local_48,this,index);
  (__return_storage_ptr__->d).d = local_c0.d.d;
  (__return_storage_ptr__->d).ptr = local_c0.d.ptr;
  (__return_storage_ptr__->d).size = local_c0.d.size;
  if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar2 = TreeModel::type(this,index);
  if ((bVar2 - 0x4f < 6) || (bVar2 == 0x42)) {
    if (local_48.d.size == 0) {
      local_108 = &(local_c0.d.d)->super_QArrayData;
      local_100 = local_c0.d.ptr;
      pQStack_f8 = (QAbstractItemModel *)local_c0.d.size;
      if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_d8.d.d = local_c0.d.d;
      local_d8.d.ptr = local_c0.d.ptr;
      local_d8.d.size = local_c0.d.size;
      if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QChar)(char16_t)&local_d8);
      local_108 = &(local_d8.d.d)->super_QArrayData;
      local_100 = local_d8.d.ptr;
      pQStack_f8 = (QAbstractItemModel *)local_d8.d.size;
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QString *)&local_108);
    }
    QString::operator=(__return_storage_ptr__,(QString *)&local_108);
    if (local_108 != (QArrayData *)0x0) {
      LOCK();
      (local_108->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_108,2,8);
      }
    }
    if (local_48.d.size == 0) goto LAB_001654c3;
  }
  else {
    if (bVar2 != 0x43) goto LAB_001654c3;
    TreeModel::findParentOfType((QModelIndex *)&local_108,this,index,'B');
    TreeModel::text(&local_d8,this,(QModelIndex *)&local_108);
    qVar1 = local_d8.d.size;
    if ((QAbstractItemModel *)local_d8.d.size == (QAbstractItemModel *)0x0) {
      TreeModel::name(&local_138,this,(QModelIndex *)&local_108);
    }
    else {
      TreeModel::name(&local_60,this,(QModelIndex *)&local_108);
      local_90 = &(local_60.d.d)->super_QArrayData;
      local_88 = local_60.d.ptr;
      qStack_80 = local_60.d.size;
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QChar)(char16_t)&local_90);
      local_138.d.d = (Data *)local_90;
      local_138.d.ptr = local_88;
      local_138.d.size = qStack_80;
      if (local_90 != (QArrayData *)0x0) {
        LOCK();
        (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_90->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QString *)&local_138);
    }
    QString::operator=(__return_storage_ptr__,(QString *)&local_138);
    if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
      }
    }
    if ((QAbstractItemModel *)qVar1 != (QAbstractItemModel *)0x0) {
      if (local_90 != (QArrayData *)0x0) {
        LOCK();
        (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_90,2,8);
        }
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
        }
      }
    }
    UVar3 = TreeModel::subtype(this,index);
    if ((UVar3 == '\x02') || (UVar3 = TreeModel::subtype(this,index), UVar3 == '\x18')) {
      TreeModel::name(&local_f0,this,index);
      local_120 = &(local_f0.d.d)->super_QArrayData;
      local_118 = local_f0.d.ptr;
      qStack_110 = local_f0.d.size;
      if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QChar)(char16_t)&local_120);
      local_138.d.d = (Data *)local_120;
      local_138.d.ptr = local_118;
      local_138.d.size = qStack_110;
      if (local_120 != (QArrayData *)0x0) {
        LOCK();
        (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_120->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QString *)&local_138);
      QString::operator=(__return_storage_ptr__,(QString *)&local_138);
      if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_120 != (QArrayData *)0x0) {
        LOCK();
        (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_120->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_120->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_120,2,8);
        }
      }
      if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,8);
        }
      }
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
LAB_001654c3:
  UVar3 = TreeModel::type(this,index);
  subtype = TreeModel::subtype(this,index);
  itemSubtypeToUString((QString *)&local_108,UVar3,subtype);
  UVar3 = TreeModel::type(this,index);
  itemTypeToUString(&local_78,UVar3);
  if (pQStack_f8 == (QAbstractItemModel *)0x0) {
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    local_a8.d.size = 0;
  }
  else {
    QString::QString(&local_a8,(QChar)0x5f);
    QString::append((QString *)&local_a8);
  }
  local_f0.d.d = local_78.d.d;
  local_f0.d.ptr = local_78.d.ptr;
  local_f0.d.size = local_78.d.size;
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::append((QString *)&local_f0);
  local_120 = &(local_f0.d.d)->super_QArrayData;
  local_118 = local_f0.d.ptr;
  qStack_110 = local_f0.d.size;
  if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::append((QChar)(char16_t)&local_120);
  local_138.d.d = (Data *)local_120;
  local_138.d.ptr = local_118;
  local_138.d.size = qStack_110;
  if (local_120 != (QArrayData *)0x0) {
    LOCK();
    (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_120->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::append((QString *)&local_138);
  QString::operator=(__return_storage_ptr__,(QString *)&local_138);
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_120 != (QArrayData *)0x0) {
    LOCK();
    (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_120->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_120->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_120,2,8);
    }
  }
  if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
    }
  }
  fixFileName(__return_storage_ptr__,true);
  if (local_108 != (QArrayData *)0x0) {
    LOCK();
    (local_108->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_108,2,8);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UString uniqueItemName(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return UString("InvalidIndex");
    
    // Get model from index
    const TreeModel* model = (const TreeModel*)index.model();
    
    // Construct the name
    UString itemName = model->name(index);
    UString itemText = model->text(index);
    
    // Default name
    UString name = itemName;
    switch (model->type(index)) {
        case Types::NvarEntry:
        case Types::VssEntry:
        case Types::SysFEntry:
        case Types::EvsaEntry:
        case Types::PhoenixFlashMapEntry:
        case Types::InsydeFlashDeviceMapEntry:
        case Types::File:
            name = itemText.isEmpty() ? itemName : itemName + '_' + itemText;
            break;
        case Types::Section: {
            // Get parent file name
            UModelIndex fileIndex = model->findParentOfType(index, Types::File);
            UString fileText = model->text(fileIndex);
            name = fileText.isEmpty() ? model->name(fileIndex) : model->name(fileIndex) + '_' + fileText;
            
            // Special case of GUIDed sections
            if (model->subtype(index) == EFI_SECTION_GUID_DEFINED || model->subtype(index) == EFI_SECTION_FREEFORM_SUBTYPE_GUID) {
                name = model->name(index) +'_' + name;
            }
        } break;
    }
    
    // Populate subtypeString
    UString subtypeString = itemSubtypeToUString(model->type(index), model->subtype(index));
    
    // Create final name
    name = itemTypeToUString(model->type(index))
    + (subtypeString.length() ? ('_' + subtypeString) : UString())
    + '_' + name;
    
    fixFileName(name, true);
    
    return name;
}